

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O2

void __thiscall
optimization::graph_color::Graph_Color::init_conflict_map
          (Graph_Color *this,shared_ptr<optimization::livevar_analyse::Block_Live_Var> *blv,
          shared_ptr<optimization::graph_color::Conflict_Map> *conflict_map,
          set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          *cross_blk_vars)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  uint32_t uVar3;
  long lVar4;
  Conflict_Map *this_00;
  bool bVar5;
  int iVar6;
  TyKind TVar7;
  size_type sVar8;
  size_type sVar9;
  _Base_ptr p_Var10;
  long lVar11;
  pointer puVar12;
  BasicBlk *pBVar13;
  VarId defVar;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  cross_use_vars;
  key_type local_120;
  BasicBlk *local_110;
  VarId local_108;
  VarId local_f8;
  VarId local_e8;
  VarId local_d8;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_c8;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_90;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_60;
  
  pBVar13 = ((blv->
             super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr)->block;
  puVar12 = (pBVar13->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var1 = &(cross_blk_vars->_M_t)._M_impl.super__Rb_tree_header;
  lVar11 = (long)puVar12 << 0x1d;
  local_110 = pBVar13;
  do {
    if (puVar12 ==
        (pBVar13->inst).
        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      p_Var2 = &local_c8._M_impl.super__Rb_tree_header;
      for (p_Var10 = (cross_blk_vars->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var10 != p_Var1;
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
        uVar3 = *(uint32_t *)&p_Var10[1]._M_parent;
        local_f8.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
        local_f8.id = uVar3;
        bVar5 = Conflict_Map::has_var
                          ((conflict_map->
                           super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr,&local_f8);
        if (!bVar5) {
          local_108.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
          local_c8._M_impl._0_8_ = 0;
          local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_c8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_108.id = uVar3;
          local_c8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
          local_c8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
          Conflict_Map::add_conflict
                    ((conflict_map->
                     super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr,&local_108,
                     (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                      *)&local_c8);
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::~_Rb_tree(&local_c8);
        }
      }
      return;
    }
    iVar6 = (**(code **)(*(long *)(puVar12->_M_t).
                                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false> + 8))();
    if (iVar6 != 7) {
      local_120.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
      local_120.id = *(uint32_t *)
                      ((long)(puVar12->_M_t).
                             super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                             .super__Head_base<0UL,_mir::inst::Inst_*,_false> + 0x10);
      local_d8.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
      local_d8.id = local_120.id;
      TVar7 = livevar_analyse::Block_Live_Var::queryTy
                        ((blv->
                         super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr,&local_d8);
      if (TVar7 != Void) {
        sVar8 = std::
                set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::count(cross_blk_vars,&local_120);
        if (sVar8 == 0) {
          sVar9 = std::
                  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                  ::count(&((conflict_map->
                            super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->merged_var_Map,&local_120);
          if (sVar9 == 0) goto LAB_00135b77;
        }
        local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_90._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_90._M_impl.super__Rb_tree_header._M_header;
        local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
        lVar4 = *(long *)((long)(((blv->
                                  super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->instLiveVars).
                                super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                         (lVar11 + (long)(pBVar13->inst).
                                         super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start * -0x20000000 >>
                         0x1c));
        local_90._M_impl.super__Rb_tree_header._M_header._M_right =
             local_90._M_impl.super__Rb_tree_header._M_header._M_left;
        std::
        __set_intersection<std::_Rb_tree_const_iterator<mir::inst::VarId>,std::_Rb_tree_const_iterator<mir::inst::VarId>,std::insert_iterator<std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (*(undefined8 *)(lVar4 + 0x18),lVar4 + 8,
                   (cross_blk_vars->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1,
                   &local_90);
        this_00 = (conflict_map->
                  super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        local_e8.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
        local_e8.id = local_120.id;
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::_Rb_tree(&local_60,&local_90);
        Conflict_Map::add_conflict
                  (this_00,&local_e8,
                   (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    *)&local_60);
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::~_Rb_tree(&local_60);
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::~_Rb_tree(&local_90);
        pBVar13 = local_110;
      }
    }
LAB_00135b77:
    puVar12 = puVar12 + 1;
    lVar11 = lVar11 + 0x100000000;
  } while( true );
}

Assistant:

void init_conflict_map(std::shared_ptr<livevar_analyse::Block_Live_Var> blv,
                         std::shared_ptr<Conflict_Map>& conflict_map,
                         std::set<mir::inst::VarId>& cross_blk_vars) {
    auto& block = blv->block;
    for (auto iter = block.inst.begin(); iter != block.inst.end(); ++iter) {
      if (iter->get()->inst_kind() == mir::inst::InstKind::Phi) {
        continue;
      }
      auto defVar = iter->get()->dest;
      if (blv->queryTy(defVar) == mir::types::TyKind::Void ||
          !cross_blk_vars.count(defVar) &&
              !conflict_map->merged_var_Map.count(defVar)) {
        continue;
      }
      int idx = iter - block.inst.begin();
      std::set<mir::inst::VarId> cross_use_vars;
      std::set_intersection(
          blv->instLiveVars[idx]->begin(), blv->instLiveVars[idx]->end(),
          cross_blk_vars.begin(), cross_blk_vars.end(),
          std::inserter(cross_use_vars, cross_use_vars.begin()));
      conflict_map->add_conflict(defVar, cross_use_vars);
    }
    for (auto var : cross_blk_vars) {
      if (!conflict_map->has_var(var)) {
        conflict_map->add_conflict(var, std::set<mir::inst::VarId>());
      }
    }
    // LOG(TRACE) << "conflict map : " << std::endl;
    // for (auto pair : conflict_map->dynamic_Map) {
    //   LOG(TRACE) << pair.first << " : ";
    //   for (auto var : pair.second) {
    //     LOG(TRACE) << var << ", ";
    //   }
    //   LOG(TRACE) << std::endl;
    // }
  }